

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

XExtDisplayInfo * find_display(Display *dpy)

{
  Display *local_20;
  XExtDisplayInfo *dpyinfo;
  Display *dpy_local;
  
  if ((nvctrl_ext_info == (XExtensionInfo *)0x0) &&
     (nvctrl_ext_info = (XExtensionInfo *)XextCreateExtension(),
     nvctrl_ext_info == (XExtensionInfo *)0x0)) {
    dpy_local = (Display *)0x0;
  }
  else {
    local_20 = (Display *)XextFindDisplay(nvctrl_ext_info,dpy);
    if (local_20 == (Display *)0x0) {
      local_20 = (Display *)
                 XextAddDisplay(nvctrl_ext_info,dpy,nvctrl_extension_name,&nvctrl_extension_hooks,5,
                                0xffffffffffffffff);
    }
    dpy_local = local_20;
  }
  return (XExtDisplayInfo *)dpy_local;
}

Assistant:

static XEXT_GENERATE_FIND_DISPLAY (find_display, nvctrl_ext_info,
                                   nvctrl_extension_name, 
                                   &nvctrl_extension_hooks,
                                   NV_CONTROL_EVENTS, NVCTRL_EXT_NEED_CHECK)

static XEXT_GENERATE_CLOSE_DISPLAY (close_display, nvctrl_ext_info)

/*
 * NV-CONTROL versions 1.8 and 1.9 pack the target_type and target_id
 * fields in reversed order.  In order to talk to one of these servers,
 * we need to swap these fields.
 */
static void XNVCTRLCheckTargetData(Display *dpy, XExtDisplayInfo *info,
                                   int *target_type, int *target_id)
{
    /* Find out what the server's NV-CONTROL version is and
     * setup for swapping if we need to.
     */
    if (info->data == NVCTRL_EXT_NEED_CHECK) {
        int major, minor;

        if (XNVCTRLQueryVersion(dpy, &major, &minor)) {
            if (major == 1 &&
                (minor == 8 || minor == 9)) {
                info->data = NVCTRL_EXT_NEED_TARGET_SWAP;
            } else {
                info->data = NVCTRL_EXT_NEED_NOTHING;
            }
        } else {
            info->data = NVCTRL_EXT_NEED_NOTHING;
        }
    }

    /* We need to swap the target_type and target_id */
    if (info->data == NVCTRL_EXT_NEED_TARGET_SWAP) {
        int tmp;
        tmp = *target_type;
        *target_type = *target_id;
        *target_id = tmp;
    }
}